

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwWindowHintString(int hint,char *value)

{
  long lVar1;
  
  if (value == (char *)0x0) {
    __assert_fail("value != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/src/window.c"
                  ,0x1a2,"void glfwWindowHintString(int, const char *)");
  }
  if (_glfw.initialized != 0) {
    if (hint == 0x24002) {
      lVar1 = 0x29c;
    }
    else if (hint == 0x24001) {
      lVar1 = 0x19c;
    }
    else {
      if (hint != 0x23002) {
        _glfwInputError(0x10003,"Invalid window hint string 0x%08X");
        return;
      }
      lVar1 = 0x9c;
    }
    strncpy((char *)((long)&_glfw.initialized + lVar1),value,0xff);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwWindowHintString(int hint, const char* value)
{
    assert(value != NULL);

    _GLFW_REQUIRE_INIT();

    switch (hint)
    {
        case GLFW_COCOA_FRAME_NAME:
            strncpy(_glfw.hints.window.ns.frameName, value,
                    sizeof(_glfw.hints.window.ns.frameName) - 1);
            return;
        case GLFW_X11_CLASS_NAME:
            strncpy(_glfw.hints.window.x11.className, value,
                    sizeof(_glfw.hints.window.x11.className) - 1);
            return;
        case GLFW_X11_INSTANCE_NAME:
            strncpy(_glfw.hints.window.x11.instanceName, value,
                    sizeof(_glfw.hints.window.x11.instanceName) - 1);
            return;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid window hint string 0x%08X", hint);
}